

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

void __thiscall wabt::Var::set_name(Var *this,string *name)

{
  string *name_local;
  Var *this_local;
  
  Destroy(this);
  this->type_ = Name;
  Construct<std::__cxx11::string,std::__cxx11::string>(&(this->field_2).name_,name);
  return;
}

Assistant:

void Var::set_name(std::string&& name) {
  Destroy();
  type_ = VarType::Name;
  Construct(name_, std::move(name));
}